

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,float,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStrictOperator<duckdb::TryCast>>
               (string_t *ldata,float *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  ulong uVar5;
  char **ppcVar6;
  ValidityMask *pVVar7;
  ValidityMask *pVVar8;
  void *pvVar9;
  unsigned_long uVar10;
  ValidityMask *pVVar11;
  ulong uVar12;
  float fVar13;
  string_t input;
  string_t input_00;
  string_t input_01;
  char **local_88;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_88 = &(ldata->value).pointer.ptr;
      pVVar7 = (ValidityMask *)0x0;
      pvVar9 = dataptr;
      do {
        input.value.pointer.ptr = (char *)result_mask;
        input.value._0_8_ = *local_88;
        fVar13 = VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,float>
                           (*(VectorTryCastStrictOperator<duckdb::TryCast> **)(local_88 + -1),input,
                            pVVar7,(idx_t)dataptr,pvVar9);
        result_data[(long)pVVar7] = fVar13;
        pVVar7 = (ValidityMask *)
                 ((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
        local_88 = local_88 + 2;
      } while ((ValidityMask *)count != pVVar7);
    }
  }
  else {
    pvVar9 = dataptr;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_40;
      peVar2 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      uVar5 = 0;
      pVVar7 = (ValidityMask *)0x0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = puVar1[uVar5];
        }
        pVVar8 = pVVar7 + 2;
        if (count <= pVVar7 + 2) {
          pVVar8 = (ValidityMask *)count;
        }
        pVVar11 = pVVar8;
        if (uVar10 != 0) {
          pVVar11 = pVVar7;
          if (uVar10 == 0xffffffffffffffff) {
            if (pVVar7 < pVVar8) {
              ppcVar6 = &ldata[(long)pVVar7].value.pointer.ptr;
              do {
                input_00.value.pointer.ptr = (char *)result_mask;
                input_00.value._0_8_ = *ppcVar6;
                fVar13 = VectorTryCastStrictOperator<duckdb::TryCast>::
                         Operation<duckdb::string_t,float>
                                   (*(VectorTryCastStrictOperator<duckdb::TryCast> **)(ppcVar6 + -1)
                                    ,input_00,pVVar11,(idx_t)dataptr,pvVar9);
                result_data[(long)pVVar11] = fVar13;
                pVVar11 = (ValidityMask *)
                          ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).
                                  validity_mask + 1);
                ppcVar6 = ppcVar6 + 2;
              } while (pVVar8 != pVVar11);
            }
          }
          else if (pVVar7 < pVVar8) {
            ppcVar6 = &ldata[(long)pVVar7].value.pointer.ptr;
            uVar12 = 0;
            do {
              if ((uVar10 >> (uVar12 & 0x3f) & 1) != 0) {
                input_01.value.pointer.ptr = (char *)result_mask;
                input_01.value._0_8_ = *ppcVar6;
                fVar13 = VectorTryCastStrictOperator<duckdb::TryCast>::
                         Operation<duckdb::string_t,float>
                                   (*(VectorTryCastStrictOperator<duckdb::TryCast> **)(ppcVar6 + -1)
                                    ,input_01,
                                    (ValidityMask *)
                                    ((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).
                                            validity_mask + uVar12),(idx_t)dataptr,pvVar9);
                result_data
                [(long)((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                       uVar12)] = fVar13;
              }
              uVar12 = uVar12 + 1;
              ppcVar6 = ppcVar6 + 2;
            } while ((undefined1 *)((long)pVVar7 + (uVar12 - (long)pVVar8)) != (undefined1 *)0x0);
            pVVar11 = (ValidityMask *)
                      ((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      uVar12);
          }
        }
        uVar5 = uVar5 + 1;
        pVVar7 = pVVar11;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}